

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSMisc.h
# Opt level: O0

void quaternion2euler(double qw,double qx,double qy,double qz,double *pRoll,double *pPitch,
                     double *pYaw)

{
  double dVar1;
  double dVar2;
  undefined8 local_60;
  undefined8 local_58;
  double *pYaw_local;
  double *pPitch_local;
  double *pRoll_local;
  double qz_local;
  double qy_local;
  double qx_local;
  double qw_local;
  
  dVar1 = sqr(qw);
  dVar2 = sqr(qz);
  dVar1 = atan2(qy * 2.0 * qz + qw * 2.0 * qx,(dVar1 + dVar1 + dVar2 * 2.0) - 1.0);
  *pRoll = dVar1;
  if (-1.0 <= qx * 2.0 * qz + -(qw * 2.0 * qy)) {
    if (qx * 2.0 * qz + -(qw * 2.0 * qy) <= 1.0) {
      local_60 = qx * 2.0 * qz + -(qw * 2.0 * qy);
    }
    else {
      local_60 = 1.0;
    }
    local_58 = local_60;
  }
  else {
    local_58 = -1.0;
  }
  dVar1 = asin(local_58);
  *pPitch = -dVar1;
  dVar1 = sqr(qw);
  dVar2 = sqr(qx);
  dVar1 = atan2(qx * 2.0 * qy + qw * 2.0 * qz,(dVar1 + dVar1 + dVar2 * 2.0) - 1.0);
  *pYaw = dVar1;
  return;
}

Assistant:

inline void quaternion2euler(double qw, double qx, double qy, double qz, double* pRoll, double* pPitch, double* pYaw)
{
	*pRoll = atan2(2*qy*qz+2*qw*qx, 2*sqr(qw)+2*sqr(qz)-1);
	*pPitch = -asin(constrain(2*qx*qz-2*qw*qy, -1, 1)); // Attempt to avoid potential NAN...
	*pYaw = atan2(2*qx*qy+2*qw*qz, 2*sqr(qw)+2*sqr(qx)-1);
}